

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_boolean64_primitive_asUInt64
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint64_t value;
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  value = *(uint64_t *)(*arguments + 0x10);
  if (value + 0x800000000000000 >> 0x3c == 0) {
    return value << 4 | 0xb;
  }
  sVar1 = sysbvm_tuple_uint64_encodeBig(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_boolean64_primitive_asUInt64(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_uint64_encode(context, sysbvm_tuple_boolean64_decode(arguments[0]));
}